

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
::
find<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry>
                 table,uint *params)

{
  uint uVar1;
  ulong uVar2;
  PromiseFulfiller<void> *pPVar3;
  PromiseFulfiller<void> *pPVar4;
  uint *in_R8;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  Maybe<unsigned_long> MVar9;
  Maybe<unsigned_long> MVar10;
  
  MVar9.ptr.field_1.value = table.size_;
  uVar2 = *(ulong *)(table.ptr + 1);
  if (uVar2 == 0) {
    *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
             )0x0;
    MVar9.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar9.ptr;
  }
  uVar1 = *in_R8;
  uVar5 = uVar1 * 0x8000 + ~uVar1;
  uVar5 = (uVar5 >> 0xc ^ uVar5) * 5;
  uVar5 = (uVar5 >> 4 ^ uVar5) * 0x809;
  uVar5 = uVar5 >> 0x10 ^ uVar5;
  uVar6 = (ulong)((int)uVar2 - 1U & uVar5);
  pPVar3 = ((table.ptr)->value).fulfiller.ptr.ptr;
  iVar8 = *(int *)((long)&pPVar3[uVar6].super_PromiseRejector._vptr_PromiseRejector + 4);
  if (iVar8 != 0) {
    pPVar4 = pPVar3 + uVar6;
    do {
      if (((iVar8 != 1) &&
          (*(uint *)&(pPVar4->super_PromiseRejector)._vptr_PromiseRejector == uVar5)) &&
         (*(uint *)(MVar9.ptr.field_1.value + (ulong)(iVar8 - 2) * 0x18) == uVar1)) {
        *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(iVar8 - 2);
        goto LAB_003597cb;
      }
      uVar7 = uVar6 + 1;
      uVar6 = uVar7 & 0xffffffff;
      if (uVar7 == uVar2) {
        uVar6 = 0;
      }
      pPVar4 = pPVar3 + uVar6;
      iVar8 = *(int *)((long)&(pPVar4->super_PromiseRejector)._vptr_PromiseRejector + 4);
    } while (iVar8 != 0);
  }
  *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
           )0x0;
LAB_003597cb:
  MVar10.ptr.field_1.value = MVar9.ptr.field_1.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }